

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigJust.c
# Opt level: O1

void Aig_ManJustExperiment(Aig_Man_t *pAig)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *vSuppLits;
  int *piVar5;
  Aig_ManPack_t *p;
  Vec_Int_t *__ptr;
  long lVar6;
  uint uVar7;
  Aig_Obj_t *pNode;
  long lVar8;
  double dVar9;
  timespec ts;
  uint local_68;
  uint local_64;
  ulong local_60;
  double local_50;
  timespec local_48;
  long local_38;
  
  iVar3 = clock_gettime(3,&local_48);
  if (iVar3 < 0) {
    lVar6 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  vSuppLits = (Vec_Int_t *)malloc(0x10);
  vSuppLits->nCap = 100;
  vSuppLits->nSize = 0;
  piVar5 = (int *)malloc(400);
  vSuppLits->pArray = piVar5;
  p = Aig_ManPackStart(pAig);
  __ptr = Aig_ManPackConstNodes(p);
  if (__ptr->nSize < 1) {
    local_50 = 0.0;
    local_60 = 0;
    local_68 = 0;
    uVar7 = 0;
    local_64 = 0;
  }
  else {
    lVar8 = 0;
    iVar3 = 0;
    local_64 = 0;
    uVar7 = 0;
    local_68 = 0;
    local_60 = 0;
    local_38 = lVar6;
    do {
      pVVar2 = pAig->vObjs;
      if (pVVar2 == (Vec_Ptr_t *)0x0) {
        pNode = (Aig_Obj_t *)0x0;
      }
      else {
        uVar1 = __ptr->pArray[lVar8];
        if (((int)uVar1 < 0) || (pVVar2->nSize <= (int)uVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pNode = (Aig_Obj_t *)pVVar2->pArray[uVar1];
      }
      if ((pNode->field_0x18 & 8) == 0) {
        iVar4 = Aig_ObjFindSatAssign(pAig,pNode,1,vSuppLits);
        if (iVar4 == 0) {
          local_64 = local_64 + 1;
        }
        else {
          uVar7 = uVar7 + 1;
LAB_0062bc03:
          iVar3 = iVar3 + vSuppLits->nSize;
          Aig_ManPackAddPattern(p,vSuppLits);
        }
      }
      else {
        iVar4 = Aig_ObjFindSatAssign(pAig,pNode,0,vSuppLits);
        if (iVar4 != 0) {
          local_60 = (ulong)((int)local_60 + 1);
          goto LAB_0062bc03;
        }
        local_68 = local_68 + 1;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < __ptr->nSize);
    local_50 = (double)iVar3;
    lVar6 = local_38;
  }
  if (vSuppLits->pArray != (int *)0x0) {
    free(vSuppLits->pArray);
    vSuppLits->pArray = (int *)0x0;
  }
  free(vSuppLits);
  dVar9 = (double)(int)((int)local_60 + uVar7);
  printf("PO =%6d. C0 =%6d. C0f =%6d. C1 =%6d. C1f =%6d. (%6.2f %%) Ave =%4.1f ",
         (dVar9 * 100.0) / (double)pAig->nObjs[3],local_50 / dVar9,(ulong)(uint)pAig->nObjs[3],
         local_60,(ulong)local_68,(ulong)uVar7,(ulong)local_64);
  iVar4 = 3;
  iVar3 = clock_gettime(3,&local_48);
  if (iVar3 < 0) {
    lVar8 = -1;
  }
  else {
    lVar8 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  Abc_Print(iVar4,"%s =","T");
  Abc_Print(iVar4,"%9.2f sec\n",(double)(lVar8 + lVar6) / 1000000.0);
  Aig_ManCleanMarkAB(pAig);
  Aig_ManPackStop(p);
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  if (__ptr != (Vec_Int_t *)0x0) {
    free(__ptr);
  }
  return;
}

Assistant:

void Aig_ManJustExperiment( Aig_Man_t * pAig )
{
    Aig_ManPack_t * pPack;
    Vec_Int_t * vSuppLits, * vNodes;
    Aig_Obj_t * pObj;
    int i;
    abctime clk = Abc_Clock();
    int Count0 = 0, Count0f = 0, Count1 = 0, Count1f = 0;
    int nTotalLits = 0;
    vSuppLits = Vec_IntAlloc( 100 );
    pPack = Aig_ManPackStart( pAig );
    vNodes = Aig_ManPackConstNodes( pPack );
//    Aig_ManForEachCo( pAig, pObj, i )
    Aig_ManForEachObjVec( vNodes, pAig, pObj, i )
    {
        if ( pObj->fPhase ) // const 1
        {
            if ( Aig_ObjFindSatAssign(pAig, pObj, 0, vSuppLits) )
            {
//                assert( Aig_ObjTerSimulate(pAig, pObj, vSuppLits) == AIG_VAL0 );
//                if ( Aig_ObjTerSimulate(pAig, pObj, vSuppLits) != AIG_VAL0 )
//                    printf( "Justification error!\n" );
                Count0++;
                nTotalLits += Vec_IntSize(vSuppLits);
                Aig_ManPackAddPattern( pPack, vSuppLits );
            }
            else
                Count0f++;
        }
        else
        {
            if ( Aig_ObjFindSatAssign(pAig, pObj, 1, vSuppLits) )
            {
//                assert( Aig_ObjTerSimulate(pAig, pObj, vSuppLits) == AIG_VAL1 );
//                if ( Aig_ObjTerSimulate(pAig, pObj, vSuppLits) != AIG_VAL1 )
//                    printf( "Justification error!\n" );
                Count1++;
                nTotalLits += Vec_IntSize(vSuppLits);
                Aig_ManPackAddPattern( pPack, vSuppLits );
            }
            else
                Count1f++;
        }
    }
    Vec_IntFree( vSuppLits );
    printf( "PO =%6d. C0 =%6d. C0f =%6d. C1 =%6d. C1f =%6d. (%6.2f %%) Ave =%4.1f ", 
        Aig_ManCoNum(pAig), Count0, Count0f, Count1, Count1f, 100.0*(Count0+Count1)/Aig_ManCoNum(pAig), 1.0*nTotalLits/(Count0+Count1) );
    Abc_PrintTime( 1, "T", Abc_Clock() - clk );
    Aig_ManCleanMarkAB( pAig );
    Aig_ManPackStop( pPack );
    Vec_IntFree( vNodes );
}